

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inffast.c
# Opt level: O2

void inflate_fast(z_streamp strm,uint start)

{
  byte *pbVar1;
  byte *pbVar2;
  z_Bytef *pzVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  ushort uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  internal_state *piVar12;
  long lVar13;
  Posf *pPVar14;
  uint uVar15;
  uint uVar16;
  z_Bytef *pzVar17;
  ulong uVar18;
  undefined4 uVar19;
  long lVar20;
  char *pcVar21;
  uint uVar22;
  ulong uVar23;
  z_Bytef *pzVar24;
  long lVar25;
  z_Bytef *pzVar26;
  uint uVar27;
  z_Bytef *pzVar28;
  long lVar29;
  uint uVar30;
  uint uVar31;
  int local_38;
  
  piVar12 = strm->state;
  pzVar26 = strm->next_in + ((ulong)(strm->avail_in - 5) - 1);
  pzVar24 = strm->next_in + -1;
  pzVar28 = strm->next_out + -1;
  local_38 = (int)pzVar28 - (start - strm->avail_out);
  pzVar17 = strm->next_out + ((ulong)(strm->avail_out - 0x101) - 1);
  iVar9 = piVar12->wrap;
  uVar10 = *(uint *)&piVar12->gzhead;
  uVar11 = *(uint *)((long)&piVar12->gzhead + 4);
  lVar25 = *(long *)&piVar12->gzindex;
  bVar4 = *(byte *)&piVar12->head;
  uVar30 = piVar12->last_flush;
  bVar5 = *(byte *)((long)&piVar12->head + 4);
  uVar15 = piVar12->w_size;
  lVar13 = *(long *)&piVar12->window_size;
  pPVar14 = piVar12->prev;
LAB_0068e241:
  if (uVar15 < 0xf) {
    pbVar1 = pzVar24 + 1;
    pbVar2 = pzVar24 + 2;
    pzVar24 = pzVar24 + 2;
    uVar30 = ((uint)*pbVar2 << ((byte)uVar15 + 8 & 0x1f)) +
             ((uint)*pbVar1 << ((byte)uVar15 & 0x1f)) + uVar30;
    uVar15 = uVar15 | 0x10;
  }
  uVar27 = uVar30 & ~(-1 << (bVar4 & 0x1f));
  while( true ) {
    uVar18 = (ulong)uVar27;
    bVar6 = *(byte *)(lVar13 + 1 + uVar18 * 4);
    uVar30 = uVar30 >> (bVar6 & 0x1f);
    bVar7 = *(byte *)(lVar13 + uVar18 * 4);
    uVar15 = uVar15 - bVar6;
    uVar8 = *(ushort *)(lVar13 + 2 + uVar18 * 4);
    uVar27 = (uint)uVar8;
    if (bVar7 == 0) break;
    if ((bVar7 & 0x10) != 0) {
      uVar22 = bVar7 & 0xf;
      if ((bVar7 & 0xf) != 0) {
        if (uVar15 < uVar22) {
          pbVar1 = pzVar24 + 1;
          pzVar24 = pzVar24 + 1;
          uVar30 = uVar30 + ((uint)*pbVar1 << ((byte)uVar15 & 0x1f));
          uVar15 = uVar15 + 8;
        }
        uVar27 = uVar27 + (~(-1 << (sbyte)uVar22) & uVar30);
        uVar30 = uVar30 >> (sbyte)uVar22;
        uVar15 = uVar15 - uVar22;
      }
      if (uVar15 < 0xf) {
        pbVar1 = pzVar24 + 1;
        pbVar2 = pzVar24 + 2;
        pzVar24 = pzVar24 + 2;
        uVar30 = ((uint)*pbVar2 << ((byte)uVar15 + 8 & 0x1f)) +
                 ((uint)*pbVar1 << ((byte)uVar15 & 0x1f)) + uVar30;
        uVar15 = uVar15 | 0x10;
      }
      uVar22 = uVar30 & ~(-1 << (bVar5 & 0x1f));
      goto LAB_0068e322;
    }
    if ((bVar7 & 0x40) != 0) {
      if ((bVar7 & 0x20) != 0) {
        uVar19 = 0xb;
        goto LAB_0068e644;
      }
      pcVar21 = "invalid literal/length code";
      goto LAB_0068e634;
    }
    uVar27 = (~(-1 << (bVar7 & 0x1f)) & uVar30) + uVar27;
  }
  pzVar28[1] = (z_Bytef)uVar8;
  pzVar28 = pzVar28 + 1;
  goto LAB_0068e5e1;
LAB_0068e322:
  uVar18 = (ulong)uVar22;
  bVar6 = *(byte *)((long)pPVar14 + uVar18 * 4 + 1);
  uVar30 = uVar30 >> (bVar6 & 0x1f);
  bVar7 = (byte)pPVar14[uVar18 * 2];
  uVar15 = uVar15 - bVar6;
  if ((bVar7 & 0x10) != 0) goto LAB_0068e35a;
  if ((bVar7 & 0x40) != 0) {
    pcVar21 = "invalid distance code";
    goto LAB_0068e634;
  }
  uVar22 = (~(-1 << (bVar7 & 0x1f)) & uVar30) + (uint)pPVar14[uVar18 * 2 + 1];
  goto LAB_0068e322;
LAB_0068e35a:
  uVar22 = bVar7 & 0xf;
  if (uVar15 < uVar22) {
    uVar30 = ((uint)pzVar24[1] << ((byte)uVar15 & 0x1f)) + uVar30;
    uVar16 = uVar15 + 8;
    if (uVar16 < uVar22) {
      pbVar1 = pzVar24 + 2;
      pzVar24 = pzVar24 + 2;
      uVar30 = uVar30 + ((uint)*pbVar1 << ((byte)uVar16 & 0x1f));
      uVar15 = uVar15 + 0x10;
    }
    else {
      pzVar24 = pzVar24 + 1;
      uVar15 = uVar16;
    }
  }
  uVar16 = (~(-1 << (sbyte)uVar22) & uVar30) + (uint)pPVar14[uVar18 * 2 + 1];
  uVar30 = uVar30 >> (sbyte)uVar22;
  uVar15 = uVar15 - uVar22;
  uVar22 = (int)pzVar28 - local_38;
  uVar18 = (ulong)uVar16;
  uVar31 = uVar16 - uVar22;
  if (uVar16 < uVar22 || uVar31 == 0) {
    lVar29 = 0;
    uVar22 = uVar27;
    do {
      lVar20 = lVar29;
      pzVar28[lVar20 + 1] = pzVar28[lVar20 + (1 - uVar18)];
      pzVar28[lVar20 + 2] = pzVar28[lVar20 + (2 - uVar18)];
      pzVar28[lVar20 + 3] = pzVar28[lVar20 + (3 - uVar18)];
      uVar22 = uVar22 - 3;
      lVar29 = lVar20 + 3;
    } while (2 < uVar22);
    if ((uint)lVar29 == uVar27) {
      pzVar28 = pzVar28 + lVar29;
    }
    else {
      pzVar28[lVar20 + 4] = pzVar28[-uVar18 + 1 + lVar29];
      if ((uint)lVar29 - uVar27 == -2) {
        pzVar3 = pzVar28 + -uVar18 + 2 + lVar29;
        pzVar28 = pzVar28 + lVar20 + 5;
        *pzVar28 = *pzVar3;
      }
      else {
        pzVar28 = pzVar28 + lVar20 + 4;
      }
    }
    goto LAB_0068e5e1;
  }
  if (uVar10 < uVar31) {
    pcVar21 = "invalid distance too far back";
LAB_0068e634:
    strm->msg = pcVar21;
    uVar19 = 0x1b;
LAB_0068e644:
    *(undefined4 *)&piVar12->strm = uVar19;
LAB_0068e647:
    lVar25 = (long)pzVar24 - (ulong)(uVar15 >> 3);
    strm->next_in = (z_Bytef *)(lVar25 + 1);
    strm->next_out = pzVar28 + 1;
    strm->avail_in = ((int)pzVar26 - (int)lVar25) + 5;
    strm->avail_out = ((int)pzVar17 - (int)pzVar28) + 0x101;
    piVar12->last_flush = ~(-1 << (sbyte)(uVar15 & 7)) & uVar30;
    piVar12->w_size = uVar15 & 7;
    return;
  }
  if (uVar11 == 0) {
    uVar23 = (ulong)(iVar9 - uVar31);
    uVar22 = uVar27 - uVar31;
    if (uVar27 < uVar31 || uVar22 == 0) goto LAB_0068e560;
    lVar29 = 0;
    do {
      pzVar28[1] = *(z_Bytef *)(uVar23 + lVar25 + lVar29);
      pzVar28 = pzVar28 + 1;
      lVar29 = lVar29 + 1;
    } while (uVar31 != (uint)lVar29);
LAB_0068e550:
    lVar29 = (long)pzVar28 - uVar18;
  }
  else {
    if (uVar11 < uVar31) {
      uVar23 = (ulong)((uVar11 + iVar9) - uVar31);
      uVar31 = uVar31 - uVar11;
      uVar22 = uVar27 - uVar31;
      if (uVar31 <= uVar27 && uVar22 != 0) {
        lVar29 = 0;
        do {
          pzVar28[lVar29 + 1] = *(z_Bytef *)(uVar23 + lVar25 + lVar29);
          lVar29 = lVar29 + 1;
        } while (uVar31 != (uint)lVar29);
        pzVar28 = pzVar28 + lVar29;
        lVar29 = lVar25 + -1;
        if (uVar11 < uVar22) {
          lVar29 = 0;
          do {
            pzVar28[1] = *(z_Bytef *)(lVar25 + lVar29);
            pzVar28 = pzVar28 + 1;
            lVar29 = lVar29 + 1;
          } while (uVar11 != (uint)lVar29);
          lVar29 = (long)pzVar28 - uVar18;
          uVar22 = uVar22 - uVar11;
        }
        goto LAB_0068e56a;
      }
    }
    else {
      uVar23 = (ulong)(uVar11 - uVar31);
      uVar22 = uVar27 - uVar31;
      if (uVar31 <= uVar27 && uVar22 != 0) {
        lVar29 = 0;
        do {
          pzVar28[1] = *(z_Bytef *)(uVar23 + lVar25 + lVar29);
          pzVar28 = pzVar28 + 1;
          lVar29 = lVar29 + 1;
        } while (uVar31 != (uint)lVar29);
        goto LAB_0068e550;
      }
    }
LAB_0068e560:
    lVar29 = uVar23 + lVar25 + -1;
    uVar22 = uVar27;
  }
LAB_0068e56a:
  lVar20 = 0;
  for (uVar27 = uVar22; 2 < uVar27; uVar27 = uVar27 - 3) {
    pzVar28[lVar20 + 1] = *(z_Bytef *)(lVar29 + 1 + lVar20);
    pzVar28[lVar20 + 2] = *(z_Bytef *)(lVar29 + 2 + lVar20);
    pzVar28[lVar20 + 3] = *(z_Bytef *)(lVar29 + 3 + lVar20);
    lVar20 = lVar20 + 3;
  }
  if ((uint)lVar20 == uVar22) {
    pzVar28 = pzVar28 + lVar20;
  }
  else {
    pzVar28[lVar20 + 1] = *(z_Bytef *)(lVar29 + 1 + lVar20);
    if ((uint)lVar20 - uVar22 == -2) {
      pzVar28 = pzVar28 + lVar20 + 2;
      *pzVar28 = *(z_Bytef *)(lVar29 + 2 + lVar20);
    }
    else {
      pzVar28 = pzVar28 + lVar20 + 1;
    }
  }
LAB_0068e5e1:
  if ((pzVar26 <= pzVar24) || (pzVar17 <= pzVar28)) goto LAB_0068e647;
  goto LAB_0068e241;
}

Assistant:

void inflate_fast(strm, start)
z_streamp strm;
unsigned start;         /* inflate()'s starting value for strm->avail_out */
{
    struct inflate_state FAR *state;
    unsigned char FAR *in;      /* local strm->next_in */
    unsigned char FAR *last;    /* while in < last, enough input available */
    unsigned char FAR *out;     /* local strm->next_out */
    unsigned char FAR *beg;     /* inflate()'s initial strm->next_out */
    unsigned char FAR *end;     /* while out < end, enough space available */
#ifdef INFLATE_STRICT
    unsigned dmax;              /* maximum distance from zlib header */
#endif
    unsigned wsize;             /* window size or zero if not using window */
    unsigned whave;             /* valid bytes in the window */
    unsigned write;             /* window write index */
    unsigned char FAR *window;  /* allocated sliding window, if wsize != 0 */
    unsigned int hold;         /* local strm->hold */
    unsigned bits;              /* local strm->bits */
    code const FAR *lcode;      /* local strm->lencode */
    code const FAR *dcode;      /* local strm->distcode */
    unsigned lmask;             /* mask for first level of length codes */
    unsigned dmask;             /* mask for first level of distance codes */
    code this;                  /* retrieved table entry */
    unsigned op;                /* code bits, operation, extra bits, or */
                                /*  window position, window bytes to copy */
    unsigned len;               /* match length, unused bytes */
    unsigned dist;              /* match distance */
    unsigned char FAR *from;    /* where to copy match from */

    /* copy state to local variables */
    state = (struct inflate_state FAR *)strm->state;
    in = strm->next_in - OFF;
    last = in + (strm->avail_in - 5);
    out = strm->next_out - OFF;
    beg = out - (start - strm->avail_out);
    end = out + (strm->avail_out - 257);
#ifdef INFLATE_STRICT
    dmax = state->dmax;
#endif
    wsize = state->wsize;
    whave = state->whave;
    write = state->write;
    window = state->window;
    hold = state->hold;
    bits = state->bits;
    lcode = state->lencode;
    dcode = state->distcode;
    lmask = (1U << state->lenbits) - 1;
    dmask = (1U << state->distbits) - 1;

    /* decode literals and length/distances until end-of-block or not enough
       input data or output space */
    do {
        if (bits < 15) {
            hold += (unsigned int)(PUP(in)) << bits;
            bits += 8;
            hold += (unsigned int)(PUP(in)) << bits;
            bits += 8;
        }
        this = lcode[hold & lmask];
      dolen:
        op = (unsigned)(this.bits);
        hold >>= op;
        bits -= op;
        op = (unsigned)(this.op);
        if (op == 0) {                          /* literal */
            Tracevv((stderr, this.val >= 0x20 && this.val < 0x7f ?
                    "inflate:         literal '%c'\n" :
                    "inflate:         literal 0x%02x\n", this.val));
            PUP(out) = (unsigned char)(this.val);
        }
        else if (op & 16) {                     /* length base */
            len = (unsigned)(this.val);
            op &= 15;                           /* number of extra bits */
            if (op) {
                if (bits < op) {
                    hold += (unsigned int)(PUP(in)) << bits;
                    bits += 8;
                }
                len += (unsigned)hold & ((1U << op) - 1);
                hold >>= op;
                bits -= op;
            }
            Tracevv((stderr, "inflate:         length %u\n", len));
            if (bits < 15) {
                hold += (unsigned int)(PUP(in)) << bits;
                bits += 8;
                hold += (unsigned int)(PUP(in)) << bits;
                bits += 8;
            }
            this = dcode[hold & dmask];
          dodist:
            op = (unsigned)(this.bits);
            hold >>= op;
            bits -= op;
            op = (unsigned)(this.op);
            if (op & 16) {                      /* distance base */
                dist = (unsigned)(this.val);
                op &= 15;                       /* number of extra bits */
                if (bits < op) {
                    hold += (unsigned int)(PUP(in)) << bits;
                    bits += 8;
                    if (bits < op) {
                        hold += (unsigned int)(PUP(in)) << bits;
                        bits += 8;
                    }
                }
                dist += (unsigned)hold & ((1U << op) - 1);
#ifdef INFLATE_STRICT
                if (dist > dmax) {
                    strm->msg = (char *)"invalid distance too far back";
                    state->mode = BAD;
                    break;
                }
#endif
                hold >>= op;
                bits -= op;
                Tracevv((stderr, "inflate:         distance %u\n", dist));
                op = (unsigned)(out - beg);     /* max distance in output */
                if (dist > op) {                /* see if copy from window */
                    op = dist - op;             /* distance back in window */
                    if (op > whave) {
                        strm->msg = (char *)"invalid distance too far back";
                        state->mode = BAD;
                        break;
                    }
                    from = window - OFF;
                    if (write == 0) {           /* very common case */
                        from += wsize - op;
                        if (op < len) {         /* some from window */
                            len -= op;
                            do {
                                PUP(out) = PUP(from);
                            } while (--op);
                            from = out - dist;  /* rest from output */
                        }
                    }
                    else if (write < op) {      /* wrap around window */
                        from += wsize + write - op;
                        op -= write;
                        if (op < len) {         /* some from end of window */
                            len -= op;
                            do {
                                PUP(out) = PUP(from);
                            } while (--op);
                            from = window - OFF;
                            if (write < len) {  /* some from start of window */
                                op = write;
                                len -= op;
                                do {
                                    PUP(out) = PUP(from);
                                } while (--op);
                                from = out - dist;      /* rest from output */
                            }
                        }
                    }
                    else {                      /* contiguous in window */
                        from += write - op;
                        if (op < len) {         /* some from window */
                            len -= op;
                            do {
                                PUP(out) = PUP(from);
                            } while (--op);
                            from = out - dist;  /* rest from output */
                        }
                    }
                    while (len > 2) {
                        PUP(out) = PUP(from);
                        PUP(out) = PUP(from);
                        PUP(out) = PUP(from);
                        len -= 3;
                    }
                    if (len) {
                        PUP(out) = PUP(from);
                        if (len > 1)
                            PUP(out) = PUP(from);
                    }
                }
                else {
                    from = out - dist;          /* copy direct from output */
                    do {                        /* minimum length is three */
                        PUP(out) = PUP(from);
                        PUP(out) = PUP(from);
                        PUP(out) = PUP(from);
                        len -= 3;
                    } while (len > 2);
                    if (len) {
                        PUP(out) = PUP(from);
                        if (len > 1)
                            PUP(out) = PUP(from);
                    }
                }
            }
            else if ((op & 64) == 0) {          /* 2nd level distance code */
                this = dcode[this.val + (hold & ((1U << op) - 1))];
                goto dodist;
            }
            else {
                strm->msg = (char *)"invalid distance code";
                state->mode = BAD;
                break;
            }
        }
        else if ((op & 64) == 0) {              /* 2nd level length code */
            this = lcode[this.val + (hold & ((1U << op) - 1))];
            goto dolen;
        }
        else if (op & 32) {                     /* end-of-block */
            Tracevv((stderr, "inflate:         end of block\n"));
            state->mode = TYPE;
            break;
        }
        else {
            strm->msg = (char *)"invalid literal/length code";
            state->mode = BAD;
            break;
        }
    } while (in < last && out < end);

    /* return unused bytes (on entry, bits < 8, so in won't go too far back) */
    len = bits >> 3;
    in -= len;
    bits -= len << 3;
    hold &= (1U << bits) - 1;

    /* update state and return */
    strm->next_in = in + OFF;
    strm->next_out = out + OFF;
    strm->avail_in = (unsigned)(in < last ? 5 + (last - in) : 5 - (in - last));
    strm->avail_out = (unsigned)(out < end ?
                                 257 + (end - out) : 257 - (out - end));
    state->hold = hold;
    state->bits = bits;
    return;
}